

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

void signalfd_in_thread_test(int which)

{
  int iVar1;
  pthread_t __threadid;
  ssize_t sVar2;
  pollfd local_158;
  pollfd pfd_2;
  pollfd pfd_1;
  pthread_t thread;
  pollfd pfd;
  epoll_event event_result;
  epoll_event event;
  int ep;
  int sfd;
  ssize_t s;
  signalfd_siginfo fdsi;
  sigset_t mask;
  int which_local;
  
  sigemptyset((sigset_t *)(fdsi.__pad + 0x14));
  sigaddset((sigset_t *)(fdsi.__pad + 0x14),2);
  iVar1 = sigprocmask(0,(sigset_t *)(fdsi.__pad + 0x14),(sigset_t *)0x0);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3c5,"sigprocmask(SIG_BLOCK, &mask, NULL) == 0");
  }
  event.data.u64._4_4_ = signalfd(-1,(sigset_t *)(fdsi.__pad + 0x14),0);
  if ((int)event.data.u64._4_4_ < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3c8,"sfd >= 0");
  }
  event.data.fd = epoll_create1(0x80000);
  if (event.data.fd < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3cb,"ep >= 0");
  }
  event_result.data.fd = 1;
  event_result.data.u64._4_4_ = event.data.u64._4_4_;
  iVar1 = epoll_ctl(event.data.fd,1,event.data.u64._4_4_,(epoll_event *)&event_result.data);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3d1);
  }
  iVar1 = epoll_wait(event.data.fd,(epoll_event *)&pfd,1,0);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3d4,"epoll_wait(ep, &event_result, 1, 0) == 0");
  }
  __threadid = pthread_self();
  iVar1 = pthread_kill(__threadid,2);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3d6,"pthread_kill(pthread_self(), SIGINT) == 0");
  }
  thread._0_4_ = event.data.fd;
  thread._4_2_ = 1;
  thread._6_2_ = 0;
  iVar1 = poll((pollfd *)&thread,1,-1);
  if (iVar1 != 1) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3df,"poll(&pfd, 1, -1) == 1");
  }
  if (thread._6_2_ != 1) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3e0,"pfd.revents == POLLIN");
  }
  iVar1 = pthread_create((pthread_t *)&pfd_1,(pthread_attr_t *)0x0,signalfd_thread,&event.data);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3e4);
  }
  iVar1 = pthread_join((pthread_t)pfd_1,(void **)0x0);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3e5);
  }
  if (which == 0) {
    local_158.fd = event.data.fd;
    local_158.events = 1;
    local_158.revents = 0;
    iVar1 = poll(&local_158,1,0);
    if (iVar1 != 0) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x3ed);
    }
    iVar1 = epoll_wait(event.data.fd,(epoll_event *)&pfd,1,0);
    if (iVar1 != 0) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x3ef,"epoll_wait(ep, &event_result, 1, 0) == 0");
    }
    iVar1 = epoll_ctl(event.data.fd,2,event.data.u64._4_4_,(epoll_event *)0x0);
    if (iVar1 != 0) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x3f1,"epoll_ctl(ep, EPOLL_CTL_DEL, sfd, NULL) == 0");
    }
    iVar1 = epoll_ctl(event.data.fd,1,event.data.u64._4_4_,(epoll_event *)&event_result.data);
    if (iVar1 != 0) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x3f2,"epoll_ctl(ep, EPOLL_CTL_ADD, sfd, &event) == 0");
    }
    iVar1 = epoll_wait(event.data.fd,(epoll_event *)&pfd,1,-1);
    if (iVar1 != 1) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x3f4,"epoll_wait(ep, &event_result, 1, -1) == 1");
    }
    if (pfd.fd != 1) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x3f5,"event_result.events == EPOLLIN");
    }
    if (pfd._4_4_ != event.data.u64._4_4_) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x3f6,"event_result.data.fd == sfd");
    }
  }
  else {
    pfd_2.fd = event.data.u64._4_4_;
    pfd_2.events = 1;
    pfd_2.revents = 0;
    iVar1 = poll((pollfd *)&pfd_2,1,-1);
    if (iVar1 != 1) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x3e9,"poll(&pfd, 1, -1) == 1");
    }
    if (pfd_2.revents != 1) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x3ea,"pfd.revents == POLLIN");
    }
  }
  sVar2 = read(event.data.u64._4_4_,&s,0x80);
  if (sVar2 != 0x80) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3fa,"s == sizeof(struct signalfd_siginfo)");
  }
  iVar1 = sigprocmask(1,(sigset_t *)(fdsi.__pad + 0x14),(sigset_t *)0x0);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3fc,"sigprocmask(SIG_UNBLOCK, &mask, NULL) == 0");
  }
  iVar1 = close(event.data.fd);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3fe,"close(ep) == 0");
  }
  iVar1 = close(event.data.u64._4_4_);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x3ff,"close(sfd) == 0");
  }
  return;
}

Assistant:

static void
signalfd_in_thread_test(int which)
{
	sigset_t mask;
	struct signalfd_siginfo fdsi;
	ssize_t s;

	sigemptyset(&mask);
	sigaddset(&mask, SIGINT);

	ATF_REQUIRE(sigprocmask(SIG_BLOCK, &mask, NULL) == 0);

	int sfd = signalfd(-1, &mask, 0);
	ATF_REQUIRE(sfd >= 0);

	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	struct epoll_event event;
	event.events = EPOLLIN;
	event.data.fd = sfd;

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, sfd, &event) == 0);

	struct epoll_event event_result;
	ATF_REQUIRE(epoll_wait(ep, &event_result, 1, 0) == 0);

	ATF_REQUIRE(pthread_kill(pthread_self(), SIGINT) == 0);

	{
		struct pollfd pfd = { .fd = ep, .events = POLLIN };
#if defined(__DragonFly__) || defined(__APPLE__)
		ATF_REQUIRE(poll(&pfd, 1, 0) == 0);
		atf_tc_skip("signals sent to threads won't trigger "
			    "EVFILT_SIGNAL on DragonFly/macOS");
#endif
		ATF_REQUIRE(poll(&pfd, 1, -1) == 1);
		ATF_REQUIRE(pfd.revents == POLLIN);
	}

	pthread_t thread;
	ATF_REQUIRE(pthread_create(&thread, NULL, signalfd_thread, &ep) == 0);
	ATF_REQUIRE(pthread_join(thread, NULL) == 0);

	if (which) {
		struct pollfd pfd = { .fd = sfd, .events = POLLIN };
		ATF_REQUIRE(poll(&pfd, 1, -1) == 1);
		ATF_REQUIRE(pfd.revents == POLLIN);
	} else {
		struct pollfd pfd = { .fd = ep, .events = POLLIN };
		ATF_REQUIRE(poll(&pfd, 1, 0) == 0);

		ATF_REQUIRE(epoll_wait(ep, &event_result, 1, 0) == 0);

		ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_DEL, sfd, NULL) == 0);
		ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, sfd, &event) == 0);

		ATF_REQUIRE(epoll_wait(ep, &event_result, 1, -1) == 1);
		ATF_REQUIRE(event_result.events == EPOLLIN);
		ATF_REQUIRE(event_result.data.fd == sfd);
	}

	s = read(sfd, &fdsi, sizeof(struct signalfd_siginfo));
	ATF_REQUIRE(s == sizeof(struct signalfd_siginfo));

	ATF_REQUIRE(sigprocmask(SIG_UNBLOCK, &mask, NULL) == 0);

	ATF_REQUIRE(close(ep) == 0);
	ATF_REQUIRE(close(sfd) == 0);
}